

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_rope_f16(ggml_compute_params *params,ggml_tensor *dst,bool forward)

{
  float *cache;
  float fVar1;
  float freq_scale;
  float ext_factor;
  float mscale;
  int32_t iVar2;
  int32_t iVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  int32_t iVar7;
  int iVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  long ne0;
  long lVar16;
  long lVar17;
  long lVar18;
  void *pvVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  undefined2 *puVar25;
  long lVar26;
  char *pcVar27;
  int iVar28;
  void *pvVar29;
  undefined8 uVar30;
  long lVar31;
  ushort *puVar32;
  undefined2 *puVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  float theta_scale;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float corr_dims [2];
  int sections [4];
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c0;
  float *local_1a8;
  long local_188;
  long local_180;
  long local_178;
  long local_160;
  long local_158;
  long local_150;
  long local_140;
  long local_130;
  long local_128;
  long local_120;
  long local_f8;
  long local_e8;
  float local_e0 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  size_t local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  size_t local_68;
  long local_60;
  long local_58;
  size_t local_50;
  undefined1 local_48 [16];
  
  pgVar9 = dst->src[0];
  pgVar10 = dst->src[1];
  pgVar11 = dst->src[2];
  iVar5 = dst->op_params[1];
  uVar37 = (ulong)iVar5;
  uVar6 = dst->op_params[2];
  iVar7 = dst->op_params[4];
  fVar1 = (float)dst->op_params[5];
  freq_scale = (float)dst->op_params[6];
  ext_factor = (float)dst->op_params[7];
  mscale = (float)dst->op_params[8];
  iVar2 = dst->op_params[9];
  iVar3 = dst->op_params[10];
  local_d8 = *(undefined8 *)(dst->op_params + 0xb);
  uStack_d0 = *(undefined8 *)(dst->op_params + 0xd);
  if (dst->nb[0] == 2) {
    sVar12 = pgVar9->nb[0];
    sVar13 = pgVar9->nb[1];
    sVar14 = pgVar9->nb[2];
    sVar15 = pgVar9->nb[3];
    ne0 = dst->ne[0];
    lVar16 = dst->ne[1];
    lVar17 = dst->ne[2];
    lVar18 = dst->ne[3];
    local_50 = dst->nb[1];
    local_68 = dst->nb[2];
    local_c8 = dst->nb[3];
    iVar8 = params->ith;
    iVar21 = params->nth;
    iVar20 = ggml_nrows(dst);
    if (ne0 < (long)uVar37) {
      pcVar27 = "n_dims <= ne0";
      uVar30 = 0x14c0;
    }
    else if ((uVar37 & 1) == 0) {
      iVar21 = (iVar21 + -1 + iVar20) / iVar21;
      iVar28 = iVar21 * iVar8;
      iVar21 = iVar21 + iVar28;
      if (iVar20 <= iVar21) {
        iVar21 = iVar20;
      }
      theta_scale = powf(fVar1,-2.0 / (float)iVar5);
      ggml_rope_yarn_corr_dims(fVar1,iVar2,iVar3,iVar5,iVar7,local_e0);
      if (((((uVar6 & 8) == 0) || (0 < (int)local_d8)) || (0 < local_d8._4_4_)) ||
         (0 < (int)uStack_d0)) {
        if ((uVar6 == 0x18) && (ne0 / 2 != uVar37)) {
          pcVar27 = "n_dims == ne0/2";
          uVar30 = 0x14db;
        }
        else {
          if (pgVar11 == (ggml_tensor *)0x0) {
            local_1a8 = (float *)0x0;
LAB_0013ed17:
            if (0 < lVar18) {
              local_48 = ZEXT416((uint)forward * 0x3f800000 + (uint)!forward * -0x40800000);
              pvVar29 = pgVar10->data;
              local_78 = (ne0 + 0x10) * (long)iVar8;
              local_88 = lVar17 * 0xc;
              local_80 = local_78 * 4 + 4;
              local_180 = (long)(iVar5 >> 1) * 2;
              local_90 = uVar37 * 2;
              local_120 = uVar37 * 2 + 2;
              local_a8 = uVar37 * 3;
              local_128 = sVar12 * uVar37 + 2;
              local_150 = 0;
              local_130 = 2;
              local_188 = 0;
              iVar8 = 0;
              local_1c0 = 0;
              local_c0 = uVar37;
              local_178 = local_90;
              local_70 = pvVar29;
              do {
                local_b8 = local_130;
                local_b0 = local_150;
                local_a0 = local_120;
                local_98 = local_128;
                if (0 < lVar17) {
                  local_60 = local_1c0 * sVar15;
                  local_140 = local_178;
                  local_158 = local_180;
                  local_160 = local_188;
                  lVar26 = 0;
                  do {
                    pvVar19 = params->wdata;
                    cache = (float *)((long)pvVar19 + local_78 * 4);
                    iVar20 = *(int *)((long)pvVar29 + lVar26 * 4);
                    if ((uVar6 & 8) == 0) {
                      ggml_rope_cache_init
                                ((float)iVar20,freq_scale,local_1a8,local_e0,ne0,ext_factor,mscale,
                                 cache,local_48._0_4_,theta_scale);
                    }
                    else {
                      ggml_mrope_cache_init
                                ((float)iVar20,
                                 (float)*(int *)((long)pvVar29 + lVar17 * 4 + lVar26 * 4),
                                 (float)*(int *)((long)pvVar29 + lVar17 * 8 + lVar26 * 4),
                                 (float)*(int *)((long)pvVar29 + local_88 + lVar26 * 4),
                                 (int *)&local_d8,uVar6 == 0x18,freq_scale,local_1a8,local_e0,ne0,
                                 ext_factor,mscale,cache,local_48._0_4_,theta_scale);
                    }
                    if (0 < lVar16) {
                      local_58 = lVar26 * sVar14;
                      iVar22 = (int)lVar16 + iVar8;
                      local_1d0 = local_120;
                      local_1d8 = local_128;
                      local_1e0 = local_130;
                      local_e8 = local_140;
                      local_f8 = local_158;
                      lVar31 = 0;
                      lVar23 = local_150;
                      lVar36 = local_160;
                      iVar20 = iVar8;
                      do {
                        if (iVar28 <= iVar20) {
                          iVar8 = iVar20 + 1;
                          if (iVar21 <= iVar20) break;
                          if ((uVar6 & 10) == 0) {
                            if (0 < iVar5) {
                              puVar32 = (ushort *)((long)pgVar9->data + local_1e0);
                              pvVar29 = dst->data;
                              lVar24 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar19 + lVar24 * 4 + local_80 + -4);
                                fVar4 = *(float *)((long)pvVar19 + lVar24 * 4 + local_80);
                                auVar38 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar32 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)puVar32[-1] * 4)),
                                                  ZEXT416((uint)fVar1));
                                auVar39 = vcvtps2ph_f16c(auVar38,0);
                                auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar32 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)puVar32[-1] * 4)),
                                                  ZEXT416((uint)fVar4));
                                auVar38 = vcvtps2ph_f16c(auVar38,0);
                                auVar38 = vpunpcklwd_avx(auVar39,auVar38);
                                *(int *)((long)pvVar29 + lVar24 * 2 + lVar23) = auVar38._0_4_;
                                lVar24 = lVar24 + 2;
                                puVar32 = puVar32 + sVar12;
                              } while (lVar24 < (long)uVar37);
                            }
                          }
                          else if (uVar6 == 0x18) {
                            if (0 < iVar5) {
                              lVar35 = 0;
                              lVar24 = 0;
                              do {
                                fVar1 = *(float *)((long)pvVar19 + lVar24 * 4 + local_80 + -4);
                                fVar4 = *(float *)((long)pvVar19 + lVar24 * 4 + local_80);
                                auVar38 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar9->data + lVar35 + local_e8) *
                                                  4))),ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar9->data
                                                                                + lVar35 + lVar36) *
                                                                        4)),ZEXT416((uint)fVar1));
                                auVar38 = vcvtps2ph_f16c(auVar38,0);
                                vpextrw_avx(auVar38,0);
                                auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar9->data + lVar35 + local_e8) *
                                                  4))),ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar9->data
                                                                                + lVar35 + lVar36) *
                                                                        4)),ZEXT416((uint)fVar4));
                                auVar38 = vcvtps2ph_f16c(auVar38,0);
                                vpextrw_avx(auVar38,0);
                                lVar24 = lVar24 + 2;
                                lVar35 = lVar35 + sVar12;
                              } while (lVar24 < (long)uVar37);
                            }
                          }
                          else if (0 < iVar5) {
                            lVar35 = 0;
                            lVar24 = 0;
                            do {
                              fVar1 = *(float *)((long)pvVar19 + lVar24 * 4 + local_80 + -4);
                              fVar4 = *(float *)((long)pvVar19 + lVar24 * 4 + local_80);
                              auVar38 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar9->data + lVar35 + local_f8) *
                                                  4))),ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar9->data
                                                                                + lVar35 + lVar36) *
                                                                        4)),ZEXT416((uint)fVar1));
                              auVar38 = vcvtps2ph_f16c(auVar38,0);
                              vpextrw_avx(auVar38,0);
                              auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar9->data + lVar35 + local_f8) *
                                                  4))),ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                        (ulong)*(ushort *)
                                                                                ((long)pgVar9->data
                                                                                + lVar35 + lVar36) *
                                                                        4)),ZEXT416((uint)fVar4));
                              auVar38 = vcvtps2ph_f16c(auVar38,0);
                              vpextrw_avx(auVar38,0);
                              lVar24 = lVar24 + 2;
                              lVar35 = lVar35 + sVar12;
                            } while (lVar24 < (long)uVar37);
                          }
                          if (uVar6 == 0x18) {
                            if ((long)uVar37 < ne0) {
                              lVar24 = lVar31 * sVar13 + local_58 + local_60;
                              uVar34 = uVar37;
                              do {
                                fVar1 = *(float *)((long)pvVar19 + uVar34 * 4 + local_80 + -4);
                                fVar4 = *(float *)((long)pvVar19 + uVar34 * 4 + local_80);
                                lVar35 = ((long)uVar34 >> 1) * sVar12;
                                auVar38 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar9->data +
                                                          uVar37 * 2 + lVar35 + lVar24) * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar9->data +
                                                                           lVar35 + lVar24) * 4)),
                                                  ZEXT416((uint)fVar1));
                                auVar38 = vcvtps2ph_f16c(auVar38,0);
                                vpextrw_avx(auVar38,0);
                                auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar9->data +
                                                          uVar37 * 2 + lVar35 + lVar24) * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar9->data +
                                                                           lVar35 + lVar24) * 4)),
                                                  ZEXT416((uint)fVar4));
                                auVar38 = vcvtps2ph_f16c(auVar38,0);
                                vpextrw_avx(auVar38,0);
                                uVar34 = uVar34 + 2;
                              } while ((long)uVar34 < ne0);
                            }
                          }
                          else if ((long)uVar37 < ne0) {
                            puVar25 = (undefined2 *)((long)pgVar9->data + local_1d8);
                            puVar33 = (undefined2 *)((long)dst->data + local_1d0);
                            uVar34 = uVar37;
                            do {
                              puVar33[-1] = puVar25[-1];
                              *puVar33 = *puVar25;
                              uVar34 = uVar34 + 2;
                              puVar25 = puVar25 + sVar12;
                              puVar33 = puVar33 + 2;
                            } while ((long)uVar34 < ne0);
                          }
                        }
                        lVar31 = lVar31 + 1;
                        lVar36 = lVar36 + sVar13;
                        local_f8 = local_f8 + sVar13;
                        lVar23 = lVar23 + local_50;
                        local_e8 = local_e8 + sVar13;
                        local_1e0 = local_1e0 + sVar13;
                        local_1d8 = local_1d8 + sVar13;
                        local_1d0 = local_1d0 + local_50;
                        iVar20 = iVar20 + 1;
                        iVar8 = iVar22;
                      } while (lVar31 != lVar16);
                    }
                    lVar26 = lVar26 + 1;
                    local_160 = local_160 + sVar14;
                    local_158 = local_158 + sVar14;
                    local_150 = local_150 + local_68;
                    local_140 = local_140 + sVar14;
                    local_130 = local_130 + sVar14;
                    local_128 = local_128 + sVar14;
                    local_120 = local_120 + local_68;
                    pvVar29 = local_70;
                  } while (lVar26 != lVar17);
                }
                local_1c0 = local_1c0 + 1;
                local_188 = local_188 + sVar15;
                local_180 = local_180 + sVar15;
                local_150 = local_b0 + local_c8;
                local_178 = local_178 + sVar15;
                local_90 = local_90 + local_c8;
                local_130 = local_b8 + sVar15;
                local_128 = local_98 + sVar15;
                local_120 = local_a0 + local_c8;
                local_c0 = local_c0 + local_c8;
                local_a8 = local_a8 + local_c8;
              } while (local_1c0 != lVar18);
            }
            return;
          }
          if (pgVar11->type == GGML_TYPE_F32) {
            if ((long)(iVar5 >> 1) <= pgVar11->ne[0]) {
              local_1a8 = (float *)pgVar11->data;
              goto LAB_0013ed17;
            }
            pcVar27 = "src2->ne[0] >= n_dims / 2";
            uVar30 = 0x14e1;
          }
          else {
            pcVar27 = "src2->type == GGML_TYPE_F32";
            uVar30 = 0x14e0;
          }
        }
      }
      else {
        pcVar27 = "sections[0] > 0 || sections[1] > 0 || sections[2] > 0";
        uVar30 = 0x14d7;
      }
    }
    else {
      pcVar27 = "n_dims % 2 == 0";
      uVar30 = 0x14c1;
    }
  }
  else {
    pcVar27 = "nb0 == sizeof(ggml_fp16_t)";
    uVar30 = 0x14b9;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar30,"GGML_ASSERT(%s) failed",pcVar27);
}

Assistant:

static void ggml_compute_forward_rope_f16(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const bool forward) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];
    const ggml_tensor * src2 = dst->src[2];

    float freq_base, freq_scale, ext_factor, attn_factor, beta_fast, beta_slow;
    int sections[4];

    //const int n_past     = ((int32_t *) dst->op_params)[0];
    const int n_dims     = ((int32_t *) dst->op_params)[1];
    const int mode       = ((int32_t *) dst->op_params)[2];
    //const int n_ctx      = ((int32_t *) dst->op_params)[3];
    const int n_ctx_orig = ((int32_t *) dst->op_params)[4];
    memcpy(&freq_base,   (int32_t *) dst->op_params +  5, sizeof(float));
    memcpy(&freq_scale,  (int32_t *) dst->op_params +  6, sizeof(float));
    memcpy(&ext_factor,  (int32_t *) dst->op_params +  7, sizeof(float));
    memcpy(&attn_factor, (int32_t *) dst->op_params +  8, sizeof(float));
    memcpy(&beta_fast,   (int32_t *) dst->op_params +  9, sizeof(float));
    memcpy(&beta_slow,   (int32_t *) dst->op_params + 10, sizeof(float));
    memcpy(&sections,    (int32_t *) dst->op_params + 11, sizeof(int)*4);


    GGML_TENSOR_UNARY_OP_LOCALS

    //printf("ne0: %d, ne1: %d, ne2: %d, ne3: %d\n", ne0, ne1, ne2, ne3);
    //printf("n_past = %d, ne2 = %d\n", n_past, ne2);

    GGML_ASSERT(nb0 == sizeof(ggml_fp16_t));

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr = ggml_nrows(dst);

    GGML_ASSERT(n_dims <= ne0);
    GGML_ASSERT(n_dims % 2 == 0);

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    // row index used to determine which thread to use
    int ir = 0;

    const float theta_scale = powf(freq_base, -2.0f/n_dims);

    float corr_dims[2];
    ggml_rope_yarn_corr_dims(n_dims, n_ctx_orig, freq_base, beta_fast, beta_slow, corr_dims);

    const bool is_neox = mode & GGML_ROPE_TYPE_NEOX;
    const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;
    const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

    if (is_mrope) {
        GGML_ASSERT(sections[0] > 0 || sections[1] > 0 || sections[2] > 0);
    }

    if (is_vision) {
        GGML_ASSERT(n_dims == ne0/2);
    }

    const float * freq_factors = NULL;
    if (src2 != NULL) {
        GGML_ASSERT(src2->type == GGML_TYPE_F32);
        GGML_ASSERT(src2->ne[0] >= n_dims / 2);
        freq_factors = (const float *) src2->data;
    }

    // backward process uses inverse rotation by cos and sin.
    // cos and sin build a rotation matrix, where the inverse is the transpose.
    // this essentially just switches the sign of sin.
    const float sin_sign = forward ? 1.0f : -1.0f;

    const int32_t * pos = (const int32_t *) src1->data;

    for (int64_t i3 = 0; i3 < ne3; i3++) {
        for (int64_t i2 = 0; i2 < ne2; i2++) {

            float * cache = (float *) params->wdata + (ne0 + CACHE_LINE_SIZE_F32)*ith;
            if (!is_mrope) {
                const int64_t p = pos[i2];
                ggml_rope_cache_init(p, freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }
            else {
                const int64_t p_t = pos[i2];
                const int64_t p_h = pos[i2 + ne2];
                const int64_t p_w = pos[i2 + ne2 * 2];
                const int64_t p_e = pos[i2 + ne2 * 3];
                ggml_mrope_cache_init(
                    p_t, p_h, p_w, p_e, sections, is_vision,
                    freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }

            for (int64_t i1 = 0; i1 < ne1; i1++) {
                if (ir++ < ir0) continue;
                if (ir   > ir1) break;

                if (is_neox || is_mrope) {
                    if (is_vision) {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = GGML_FP16_TO_FP32(src[0]);
                            const float x1 = GGML_FP16_TO_FP32(src[n_dims]);

                            dst_data[0]      = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                            dst_data[n_dims] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                        }
                    } else {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = GGML_FP16_TO_FP32(src[0]);
                            const float x1 = GGML_FP16_TO_FP32(src[n_dims/2]);

                            dst_data[0]        = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                            dst_data[n_dims/2] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                        }
                    }
                } else {
                    for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                              ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        const float x0 = GGML_FP16_TO_FP32(src[0]);
                        const float x1 = GGML_FP16_TO_FP32(src[1]);

                        dst_data[0] = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                        dst_data[1] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                    }
                }

                if (is_vision) {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const int64_t ic = i0/2;

                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                        ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                        const float x0 = GGML_FP16_TO_FP32(src[0]);
                        const float x1 = GGML_FP16_TO_FP32(src[n_dims]);

                        dst_data[0]      = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                        dst_data[n_dims] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                    }
                } else {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                        ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        dst_data[0] = src[0];
                        dst_data[1] = src[1];
                    }
                }
            }
        }
    }
}